

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

void * rw::xbox::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  
  piVar1 = *(int **)((long)object + 0x98);
  if ((piVar1 != (int *)0x0) && (*piVar1 == 5)) {
    *(undefined8 *)((long)object + 0x98) = 0;
    (*DAT_00149de0)(*(undefined8 *)(piVar1 + 6));
    (*DAT_00149de0)(*(undefined8 *)(piVar1 + 10));
    (*DAT_00149de0)(*(undefined8 *)(piVar1 + 0xe));
    (*DAT_00149de0)(piVar1);
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	rwFree(header->vertexBuffer);
	rwFree(header->begin);
	rwFree(header->data);
	rwFree(header);
	return object;
}